

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void multi_sink_example(void)

{
  logger logger;
  shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> file_sink;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> console_sink;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_>
  *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  level_enum in_stack_fffffffffffffe24;
  logger *in_stack_fffffffffffffe28;
  bool *in_stack_fffffffffffffe40;
  undefined1 **ppuVar1;
  char (*in_stack_fffffffffffffe48) [19];
  undefined1 **ppuVar2;
  allocator *name;
  logger *this;
  sinks_init_list in_stack_fffffffffffffe78;
  undefined1 *local_168;
  undefined8 local_160;
  allocator local_151;
  string local_150 [56];
  string *in_stack_fffffffffffffee8;
  ansicolor_sink<spdlog::details::console_mutex> *in_stack_fffffffffffffef0;
  allocator local_41;
  string local_40 [48];
  
  this = (logger *)&stack0xfffffffffffffff0;
  std::make_shared<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>();
  std::
  __shared_ptr_access<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x10dd83);
  spdlog::sinks::sink::set_level((sink *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  std::
  __shared_ptr_access<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x10dd9f);
  name = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"[multi_sink_example] [%^%l%$] %v",name);
  spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_pattern
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::make_shared<spdlog::sinks::basic_file_sink<std::mutex>,char_const(&)[19],bool>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::
  __shared_ptr_access<spdlog::sinks::basic_file_sink<std::mutex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<spdlog::sinks::basic_file_sink<std::mutex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x10de32);
  spdlog::sinks::sink::set_level((sink *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"multi_sink",&local_151);
  std::shared_ptr<spdlog::sinks::sink>::
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,void>
            ((shared_ptr<spdlog::sinks::sink> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_stack_fffffffffffffe18
            );
  std::shared_ptr<spdlog::sinks::sink>::shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>,void>
            ((shared_ptr<spdlog::sinks::sink> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> *)in_stack_fffffffffffffe18);
  local_160 = 2;
  local_168 = &stack0xfffffffffffffe78;
  spdlog::logger::logger(this,(string *)name,in_stack_fffffffffffffe78);
  ppuVar1 = (undefined1 **)&stack0xfffffffffffffe78;
  ppuVar2 = &local_168;
  do {
    ppuVar2 = ppuVar2 + -2;
    std::shared_ptr<spdlog::sinks::sink>::~shared_ptr((shared_ptr<spdlog::sinks::sink> *)0x10defa);
  } while (ppuVar2 != ppuVar1);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  spdlog::logger::set_level(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  spdlog::logger::warn<char[44]>
            ((logger *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (char (*) [44])in_stack_fffffffffffffe18);
  spdlog::logger::info<char[64]>
            ((logger *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (char (*) [64])in_stack_fffffffffffffe18);
  spdlog::logger::~logger((logger *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  std::shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_>::~shared_ptr
            ((shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> *)0x10df82);
  std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_>::
  ~shared_ptr((shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> *)
              0x10df8f);
  return;
}

Assistant:

void multi_sink_example() {
    auto console_sink = std::make_shared<spdlog::sinks::stdout_color_sink_mt>();
    console_sink->set_level(spdlog::level::warn);
    console_sink->set_pattern("[multi_sink_example] [%^%l%$] %v");

    auto file_sink =
        std::make_shared<spdlog::sinks::basic_file_sink_mt>("logs/multisink.txt", true);
    file_sink->set_level(spdlog::level::trace);

    spdlog::logger logger("multi_sink", {console_sink, file_sink});
    logger.set_level(spdlog::level::debug);
    logger.warn("this should appear in both console and file");
    logger.info("this message should not appear in the console, only in the file");
}